

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct32_stage6_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *cospim16,
                       __m256i *cospi48,__m256i *cospi16,__m256i *cospim48,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [16];
  undefined1 (*in_stack_00000008) [32];
  
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[5],(undefined1  [32])*cospim32);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[6],(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)rounding));
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[6],(undefined1  [32])bf1[5]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)rounding));
  bf1[6] = alVar4;
  bf1[5] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xb],(undefined1  [32])bf1[8]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[8],(undefined1  [32])bf1[0xb]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*cospim48);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*cospim48);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  bf1[8] = alVar3;
  bf1[0xb] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[10],(undefined1  [32])bf1[9]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[9],(undefined1  [32])bf1[10]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*cospim48);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*cospim48);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  bf1[9] = alVar3;
  bf1[10] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xc],(undefined1  [32])bf1[0xf]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0xf],(undefined1  [32])bf1[0xc]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*cospim48);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*cospim48);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  bf1[0xf] = alVar3;
  bf1[0xc] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])bf1[0xe]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0xe],(undefined1  [32])bf1[0xd]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*cospim48);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*cospim48);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  bf1[0xe] = alVar3;
  bf1[0xd] = alVar4;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x12],(undefined1  [32])*cospim16);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])*cospi48);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar5 = ZEXT416((uint)rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpmulld_avx2((undefined1  [32])*cospi48,(undefined1  [32])bf1[0x12]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])*cospi16);
  auVar1 = vpaddd_avx2((undefined1  [32])*clamp_hi,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x1d] = alVar4;
  bf1[0x12] = alVar3;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x13],(undefined1  [32])*cospim16);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1c],(undefined1  [32])*cospi48);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpmulld_avx2((undefined1  [32])*cospi48,(undefined1  [32])bf1[0x13]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1c],(undefined1  [32])*cospi16);
  auVar1 = vpaddd_avx2((undefined1  [32])*clamp_hi,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x1c] = alVar4;
  bf1[0x13] = alVar3;
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x14],*in_stack_00000008);
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])*cospim16);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar5 = ZEXT416((uint)rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpmulld_avx2((undefined1  [32])*cospim16,(undefined1  [32])bf1[0x14]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])*cospi48);
  auVar1 = vpaddd_avx2((undefined1  [32])*clamp_hi,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x1b] = alVar4;
  bf1[0x14] = alVar3;
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x15],*in_stack_00000008);
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])*cospim16);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpmulld_avx2((undefined1  [32])*cospim16,(undefined1  [32])bf1[0x15]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])*cospi48);
  auVar1 = vpaddd_avx2((undefined1  [32])*clamp_hi,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x1a] = alVar4;
  bf1[0x15] = alVar3;
  return;
}

Assistant:

static inline void idct32_stage6_avx2(
    __m256i *bf1, const __m256i *cospim32, const __m256i *cospi32,
    const __m256i *cospim16, const __m256i *cospi48, const __m256i *cospi16,
    const __m256i *cospim48, const __m256i *clamp_lo, const __m256i *clamp_hi,
    const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  temp1 = half_btf_avx2(cospim32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[6] = half_btf_avx2(cospi32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[5] = temp1;

  addsub_avx2(bf1[8], bf1[11], bf1 + 8, bf1 + 11, clamp_lo, clamp_hi);
  addsub_avx2(bf1[9], bf1[10], bf1 + 9, bf1 + 10, clamp_lo, clamp_hi);
  addsub_avx2(bf1[15], bf1[12], bf1 + 15, bf1 + 12, clamp_lo, clamp_hi);
  addsub_avx2(bf1[14], bf1[13], bf1 + 14, bf1 + 13, clamp_lo, clamp_hi);

  temp1 = half_btf_avx2(cospim16, &bf1[18], cospi48, &bf1[29], rounding, bit);
  bf1[29] = half_btf_avx2(cospi48, &bf1[18], cospi16, &bf1[29], rounding, bit);
  bf1[18] = temp1;
  temp2 = half_btf_avx2(cospim16, &bf1[19], cospi48, &bf1[28], rounding, bit);
  bf1[28] = half_btf_avx2(cospi48, &bf1[19], cospi16, &bf1[28], rounding, bit);
  bf1[19] = temp2;
  temp1 = half_btf_avx2(cospim48, &bf1[20], cospim16, &bf1[27], rounding, bit);
  bf1[27] = half_btf_avx2(cospim16, &bf1[20], cospi48, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 = half_btf_avx2(cospim48, &bf1[21], cospim16, &bf1[26], rounding, bit);
  bf1[26] = half_btf_avx2(cospim16, &bf1[21], cospi48, &bf1[26], rounding, bit);
  bf1[21] = temp2;
}